

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O0

ByteCodeParser * __thiscall
stackjit::ByteCodeParser::currentTokenToLower_abi_cxx11_(ByteCodeParser *this)

{
  ByteCodeParser local_38;
  ByteCodeParser *this_local;
  
  this_local = this;
  currentToken_abi_cxx11_(&local_38);
  anon_unknown_0::toLower((anon_unknown_0 *)this,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

std::string ByteCodeParser::currentTokenToLower() const {
		return toLower(currentToken());
	}